

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

bool __thiscall BoardView::AnyItemVisible(BoardView *this)

{
  EBoardSide EVar1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer psVar5;
  element_type *peVar6;
  bool bVar7;
  bool bVar8;
  shared_ptr<Component> *p;
  pointer psVar9;
  pointer psVar10;
  
  if (this->m_searchComponents == true) {
    psVar9 = (this->m_partHighlighted).
             super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->m_partHighlighted).
             super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar9 != psVar2) {
      bVar7 = false;
      do {
        peVar3 = (psVar9->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var4 = (psVar9->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        if (peVar3 == (element_type *)0x0) {
          bVar8 = true;
        }
        else {
          EVar1 = (peVar3->super_BoardElement).board_side;
          bVar8 = EVar1 == kBoardSideBoth || EVar1 == this->m_current_side;
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        bVar7 = (bool)(bVar7 | bVar8);
        psVar9 = psVar9 + 1;
      } while (psVar9 != psVar2);
      goto LAB_0011bc82;
    }
  }
  bVar7 = false;
LAB_0011bc82:
  if ((!bVar7) && (this->m_searchNets == true)) {
    psVar5 = (this->m_pinHighlighted).
             super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (psVar10 = (this->m_pinHighlighted).
                   super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                   _M_impl.super__Vector_impl_data._M_start; psVar10 != psVar5;
        psVar10 = psVar10 + 1) {
      peVar6 = (psVar10->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar3 = (peVar6->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var4 = (peVar6->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      if (peVar3 == (element_type *)0x0) {
        bVar8 = true;
      }
      else {
        EVar1 = (peVar3->super_BoardElement).board_side;
        bVar8 = EVar1 == kBoardSideBoth || EVar1 == this->m_current_side;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      bVar7 = (bool)(bVar7 | bVar8);
    }
  }
  return bVar7;
}

Assistant:

bool BoardView::AnyItemVisible(void) {
	bool any_visible = false;

	if (m_searchComponents) {
		for (auto &p : m_partHighlighted) {
			any_visible |= BoardElementIsVisible(p);
		}
	}

	if (!any_visible) {
		if (m_searchNets) {
			for (auto &p : m_pinHighlighted) {
				any_visible |= BoardElementIsVisible(p->component);
			}
		}
	}

	return any_visible;
}